

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

string * __thiscall
QUtil::toUTF16_abi_cxx11_(string *__return_storage_ptr__,QUtil *this,unsigned_long uval)

{
  uint uVar1;
  uint3 *local_30;
  undefined8 local_28;
  uint3 local_20;
  undefined1 uStack_1d;
  undefined1 local_1c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((ulong)this & 0xfffffffffffff800) == 0xd800) {
LAB_001f3ec3:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  else {
    uVar1 = (uint)this;
    if (this < (QUtil *)0x10000) {
      local_28 = 2;
      local_20 = (uint3)(ushort)((ushort)(uVar1 << 8) | (ushort)((ulong)this >> 8));
    }
    else {
      if ((QUtil *)((long)&__DT_RELA[0x7e5].r_offset + 7) < this) goto LAB_001f3ec3;
      _local_20 = (uVar1 + 0xf0000 >> 2 & 0xff00 | (uVar1 & 0x300) << 8 | uVar1 << 0x18) +
                  (uVar1 + 0xf0000 >> 0x12 & 3) + 0xdc00d8;
      local_28 = 4;
      local_1c = 0;
    }
    local_30 = &local_20;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::toUTF16(unsigned long uval)
{
    std::string result;
    if ((uval >= 0xd800) && (uval <= 0xdfff)) {
        result = "\xff\xfd";
    } else if (uval <= 0xffff) {
        char out[2];
        out[0] = static_cast<char>((uval & 0xff00) >> 8);
        out[1] = static_cast<char>(uval & 0xff);
        result = std::string(out, 2);
    } else if (uval <= 0x10ffff) {
        char out[4];
        uval -= 0x10000;
        unsigned short high = static_cast<unsigned short>(((uval & 0xffc00) >> 10) + 0xd800);
        unsigned short low = static_cast<unsigned short>((uval & 0x3ff) + 0xdc00);
        out[0] = static_cast<char>((high & 0xff00) >> 8);
        out[1] = static_cast<char>(high & 0xff);
        out[2] = static_cast<char>((low & 0xff00) >> 8);
        out[3] = static_cast<char>(low & 0xff);
        result = std::string(out, 4);
    } else {
        result = "\xff\xfd";
    }

    return result;
}